

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

u32string *
anon_unknown.dwarf_eb88::codecvt_u16_to_u32(u32string *__return_storage_ptr__,u16string *u16)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar2;
  char16_t *__first;
  string u8;
  byte_string local_a0;
  wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  local_80;
  
  local_80._M_cvt._M_t.
  super___uniq_ptr_impl<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
  .super__Head_base<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>,_true,_true>
                  )operator_new(0x20);
  *(undefined4 *)
   ((long)local_80._M_cvt._M_t.
          super___uniq_ptr_impl<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          .
          super__Head_base<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
          ._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)local_80._M_cvt._M_t.
          super___uniq_ptr_impl<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          .
          super__Head_base<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
          ._M_head_impl + 0x10) = 0x10ffff;
  *(undefined4 *)
   ((long)local_80._M_cvt._M_t.
          super___uniq_ptr_impl<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          .
          super__Head_base<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
          ._M_head_impl + 0x18) = 0;
  *(undefined ***)
   local_80._M_cvt._M_t.
   super___uniq_ptr_impl<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
   .super__Head_base<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>.
   _M_head_impl = &PTR____codecvt_utf8_utf16_base_00111c58;
  paVar1 = &local_80._M_byte_err_string.field_2;
  local_80._M_byte_err_string._M_string_length = 0;
  local_80._M_byte_err_string.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_80._M_wide_err_string.field_2;
  local_80._M_wide_err_string._M_string_length = 0;
  local_80._M_wide_err_string.field_2._M_local_buf[0] =
       (uint)(ushort)local_80._M_wide_err_string.field_2._M_allocated_capacity._2_2_ << 0x10;
  local_80._M_state.__count = 0;
  local_80._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  local_80._M_count = 0;
  local_80._M_with_cvtstate = false;
  local_80._M_with_strings = false;
  __first = (u16->_M_dataplus)._M_p;
  local_80._M_byte_err_string._M_dataplus._M_p = (pointer)paVar1;
  local_80._M_wide_err_string._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::to_bytes(&local_a0,
             (wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
              *)&local_80,__first,__first + u16->_M_string_length);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::~wstring_convert((wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                      *)&local_80);
  local_80._M_cvt._M_t.
  super___uniq_ptr_impl<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
  .super__Head_base<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>,_true,_true>
                  )operator_new(0x20);
  *(undefined4 *)
   ((long)local_80._M_cvt._M_t.
          super___uniq_ptr_impl<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          .
          super__Head_base<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
          ._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)local_80._M_cvt._M_t.
          super___uniq_ptr_impl<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          .
          super__Head_base<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
          ._M_head_impl + 0x10) = 0x10ffff;
  *(undefined4 *)
   ((long)local_80._M_cvt._M_t.
          super___uniq_ptr_impl<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          .
          super__Head_base<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
          ._M_head_impl + 0x18) = 0;
  *(undefined ***)
   local_80._M_cvt._M_t.
   super___uniq_ptr_impl<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_>_>
   .super__Head_base<0UL,_std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>.
   _M_head_impl = &PTR____codecvt_utf8_base_00111d08;
  local_80._M_byte_err_string._M_string_length = 0;
  local_80._M_byte_err_string.field_2._M_local_buf[0] = '\0';
  local_80._M_wide_err_string._M_string_length = 0;
  local_80._M_wide_err_string.field_2._M_local_buf[0] = L'\0';
  local_80._M_state.__count = 0;
  local_80._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  local_80._M_count = 0;
  local_80._M_with_cvtstate = false;
  local_80._M_with_strings = false;
  local_80._M_byte_err_string._M_dataplus._M_p = (pointer)paVar1;
  local_80._M_wide_err_string._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  ::from_bytes(__return_storage_ptr__,&local_80,local_a0._M_dataplus._M_p,
               local_a0._M_dataplus._M_p + local_a0._M_string_length);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  ::~wstring_convert(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline
u32string codecvt_u16_to_u32(const u16string& u16)
{
    // You might expect std::codecvt_utf16<char32_t> to convert between
    // char16_t and char32_t, but it does not; rather, it operates on
    // UTF-16 encoded *byte* strings. This is not what we want.
    // We could try to reinterpret_cast<> our way around the problem, but this
    // is ugly and error prone. The easiest way is to do the conversion in two
    // steps, to UTF-8 and then to UTF-32. While this might be "unfair" on
    // codecvt for benchmark purposes, it does rather demonstrate what a
    // terrible API it is.
    const string u8 = codecvt_u16_to_u8(u16);
    return codecvt_u8_to_u32(u8);
}